

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall Sudoku::permuteNumbers(Sudoku *this)

{
  initializer_list<int> __l;
  int iVar1;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  element_type *this_00;
  reference pvVar4;
  uint local_c4;
  uint local_c0;
  int y;
  int x;
  allocator<int> local_a9;
  int local_a8 [28];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> permutation;
  Sudoku *this_local;
  
  local_a8[0x14] = 1;
  local_a8[0x15] = 0x10;
  local_a8[0x16] = 0x17;
  local_a8[0x17] = 9;
  local_a8[0x10] = 0x11;
  local_a8[0x11] = 8;
  local_a8[0x12] = 4;
  local_a8[0x13] = 0x14;
  local_a8[0xc] = 0xd;
  local_a8[0xd] = 5;
  local_a8[0xe] = 0xf;
  local_a8[0xf] = 0xb;
  local_a8[8] = 0xc;
  local_a8[9] = 6;
  local_a8[10] = 0x16;
  local_a8[0xb] = 0x15;
  local_a8[4] = 10;
  local_a8[5] = 0xf;
  local_a8[6] = 0xe;
  local_a8[7] = 2;
  local_a8[0] = 3;
  local_a8[1] = 0x18;
  local_a8[2] = 0xd;
  local_a8[3] = 7;
  local_a8[0x18] = 0x19;
  local_38 = local_a8;
  local_30 = 0x19;
  permutation.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_a9);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_a9);
  std::allocator<int>::~allocator(&local_a9);
  for (local_c0 = 0; (int)local_c0 < this->squared_size_; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; (int)local_c4 < this->squared_size_; local_c4 = local_c4 + 1) {
      iVar1 = (*this->_vptr_Sudoku[7])(this,(ulong)local_c0,(ulong)local_c4);
      p_Var2 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
               operator[](&this->fields_,(long)iVar1);
      peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var2);
      iVar1 = Field::value(peVar3);
      if (0 < iVar1) {
        iVar1 = (*this->_vptr_Sudoku[7])(this,(ulong)local_c0,(ulong)local_c4);
        p_Var2 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](&this->fields_,(long)iVar1);
        peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var2);
        iVar1 = (*this->_vptr_Sudoku[7])(this,(ulong)local_c0,(ulong)local_c4);
        p_Var2 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](&this->fields_,(long)iVar1);
        this_00 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var2);
        iVar1 = Field::value(this_00);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_28,(long)(iVar1 + -1));
        Field::setValue(peVar3,*pvVar4);
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void Sudoku::permuteNumbers()
{
  //generate random permutation
  //srand(std::time(NULL));
  //std::vector<int> permutation(squared_size_) = {21, 8, 1, 19, 14, 10, 4, 18, 24, 5, 16, 9, 3, 7, 6, 22};
  //std::vector<int> permutation = {21, 8, 1, 19, 14, 10, 4, 18, 24, 5, 16, 9, 3, 7, 6, 22, };
  //                              1, 2,  3,  4,  5, 6,  7,  8, 9, 10, 11, 12, 13,14, 15, 16, 17,18,19, 20,21, 22, 23,24, 25
  std::vector<int> permutation = {3, 24, 13, 7, 10, 15, 14, 2, 12, 6, 22, 21, 13, 5, 15, 11, 17, 8, 4, 20, 1, 16, 23, 9, 25};

  if(false)
  {
    for(int i=0; i<squared_size_; i++)
    {
      permutation[i] = i+1;
    }

    for(int i=0; i<squared_size_; i++)
    {
      int index = rand() % (squared_size_-i) + i;
      std::swap(permutation[i], permutation[index]);
    }
  }

  // apply permutation
  for(int x = 0; x < squared_size_; x++)
  {
    for (int y = 0; y < squared_size_; y++)
    {
      if(fields_[index(x,y)]->value() > 0)
        fields_[index(x,y)]->setValue(permutation[fields_[index(x,y)]->value()-1]);
    }
  }
}